

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O0

void __thiscall w3Interp::Local_tee(w3Interp *this)

{
  w3Tag wVar1;
  w3Tag *pwVar2;
  w3StackValue *pwVar3;
  Value *pVVar4;
  string local_c0;
  byte local_99;
  string local_98;
  byte local_71;
  string local_70;
  byte local_39;
  string local_38;
  ulong local_18;
  size_t i;
  w3Interp *this_local;
  
  local_18 = (ulong)(((this->super_Wasm).instr)->super_w3DecodedInstructionZeroInit).field_0.u32;
  local_39 = 0;
  i = (size_t)this;
  if (this->frame->param_and_local_count <= local_18) {
    StringFormat_abi_cxx11_(&local_38,"%lX %lX",local_18,this->frame->param_and_local_count);
    local_39 = 1;
    AssertFailedFormat("i < frame->param_and_local_count",&local_38);
  }
  if ((local_39 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (local_18 < this->frame->param_count) {
    pwVar2 = w3Stack::tag(&this->super_w3Stack);
    local_71 = 0;
    if (*pwVar2 != this->frame->param_types[local_18]) {
      pwVar2 = w3Stack::tag(&this->super_w3Stack);
      StringFormat_abi_cxx11_
                (&local_70,"%X %lX",(ulong)*pwVar2,(ulong)this->frame->param_types[local_18]);
      local_71 = 1;
      AssertFailedFormat("tag () == frame->param_types [i]",&local_70);
    }
    if ((local_71 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  else {
    pwVar2 = w3Stack::tag(&this->super_w3Stack);
    local_99 = 0;
    if (*pwVar2 != this->frame->local_only_types[local_18 - this->frame->param_count]) {
      pwVar2 = w3Stack::tag(&this->super_w3Stack);
      StringFormat_abi_cxx11_
                (&local_98,"%X %X",(ulong)*pwVar2,
                 (ulong)this->frame->local_only_types[local_18 - this->frame->param_count]);
      local_99 = 1;
      AssertFailedFormat("tag () == frame->local_only_types [i - frame->param_count]",&local_98);
    }
    if ((local_99 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_98);
    }
  }
  pwVar2 = w3Stack::tag(&this->super_w3Stack);
  wVar1 = *pwVar2;
  pwVar3 = w3Frame::Local(this->frame,local_18);
  if (wVar1 != (pwVar3->value).tag) {
    pwVar2 = w3Stack::tag(&this->super_w3Stack);
    wVar1 = *pwVar2;
    pwVar3 = w3Frame::Local(this->frame,local_18);
    StringFormat_abi_cxx11_(&local_c0,"%X %X",(ulong)wVar1,(ulong)(pwVar3->value).tag);
    AssertFailedFormat("tag () == frame->Local (i).value.tag",&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  pVVar4 = w3Stack::value(&this->super_w3Stack);
  pwVar3 = w3Frame::Local(this->frame,local_18);
  (pwVar3->value).value = *pVVar4;
  return;
}

Assistant:

INTERP (Local_tee)
{
    //__debugbreak ();
    const size_t i = instr->u32;
    AssertFormat (i < frame->param_and_local_count, ("%" FORMAT_SIZE "X %" FORMAT_SIZE "X", i, frame->param_and_local_count));
    if (i < frame->param_count)
        AssertFormat (tag () == frame->param_types [i], ("%X %" FORMAT_SIZE "X", tag (), frame->param_types [i]));
    else
        AssertFormat (tag () == frame->local_only_types [i - frame->param_count], ("%X %X", tag (), frame->local_only_types [i - frame->param_count]));
    AssertFormat (tag () == frame->Local (i).value.tag, ("%X %X", tag (), frame->Local (i).value.tag));
    frame->Local (i).value.value = value ();
}